

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O0

bool adios2::utils::introspectAsBPFile(ifstream *f,string *name)

{
  long *plVar1;
  bool bVar2;
  streamoff sVar3;
  char *pcVar4;
  byte *pbVar5;
  reference pvVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  ulong uVar10;
  undefined1 *puVar11;
  long *in_RDI;
  int pos;
  uint8_t patch;
  uint8_t minor;
  uint8_t major;
  uint64_t AttributesIndexStart;
  uint64_t VarsIndexStart;
  uint64_t PGIndexStart;
  string VersionTag;
  size_t position;
  int8_t BPVersion;
  int8_t fileType;
  bool IsBigEndian;
  uint8_t endianness;
  pos_type flength;
  vector<char,_std::allocator<char>_> buffer;
  int MFOOTERSIZE;
  undefined8 in_stack_fffffffffffffee0;
  undefined1 isLittleEndian;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  byte local_a3;
  byte local_a2;
  byte local_a1;
  allocator local_81;
  string local_80 [32];
  undefined8 local_60;
  char local_58;
  char local_57;
  byte local_56;
  byte local_55;
  int local_54;
  fpos local_50 [22];
  allocator<char> local_3a;
  undefined1 local_39;
  vector<char,_std::allocator<char>_> local_38;
  undefined4 local_1c;
  long *local_10;
  byte local_1;
  
  isLittleEndian = (undefined1)((ulong)in_stack_fffffffffffffee0 >> 0x38);
  local_1c = 0x38;
  local_39 = 0;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_ffffffffffffff00,CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8)
             ,(value_type_conflict *)in_stack_fffffffffffffef0,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  std::allocator<char>::~allocator(&local_3a);
  std::istream::seekg((long)local_10,_S_beg);
  local_50._0_16_ = std::istream::tellg();
  sVar3 = std::fpos::operator_cast_to_long(local_50);
  if (sVar3 < 0x38) {
    local_1 = 0;
    local_54 = 1;
    goto LAB_0014cd3d;
  }
  std::istream::seekg((long)local_10,0xffffffc8);
  plVar1 = local_10;
  pcVar4 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x14c871);
  std::istream::read((char *)plVar1,(long)pcVar4);
  bVar2 = std::ios::operator_cast_to_bool((ios *)((long)local_10 + *(long *)(*local_10 + -0x18)));
  if (bVar2) {
    pbVar5 = (byte *)std::vector<char,_std::allocator<char>_>::operator[](&local_38,0x34);
    local_55 = *pbVar5;
    if (1 < local_55) {
      local_1 = 0;
      local_54 = 1;
      goto LAB_0014cd3d;
    }
    local_56 = -(local_55 == 1) & 1;
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[](&local_38,0x36);
    local_57 = *pvVar6;
    if (((local_57 != '\0') && (local_57 != '\x02')) && (local_57 != '\x03')) {
      local_1 = 0;
      local_54 = 1;
      goto LAB_0014cd3d;
    }
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[](&local_38,0x37);
    local_58 = *pvVar6;
    if ((local_58 < '\x01') || ('\x03' < local_58)) {
      local_1 = 0;
      local_54 = 1;
      goto LAB_0014cd3d;
    }
    local_60 = 0;
    pcVar4 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x14c9c6);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,pcVar4,0x1c,&local_81);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    local_60 = 0x1c;
    if ((local_56 & 1) == 0) {
      uVar7 = helper::ReadValue<unsigned_long>
                        (in_stack_fffffffffffffef0,
                         (size_t *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                         (bool)isLittleEndian);
      uVar8 = helper::ReadValue<unsigned_long>
                        (in_stack_fffffffffffffef0,
                         (size_t *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                         (bool)isLittleEndian);
      uVar9 = helper::ReadValue<unsigned_long>
                        (in_stack_fffffffffffffef0,
                         (size_t *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                         (bool)isLittleEndian);
      if ((uVar7 < uVar8) && (uVar8 < uVar9)) {
        uVar10 = std::fpos::operator_cast_to_long(local_50);
        if (uVar9 < uVar10) goto LAB_0014cb14;
      }
      local_1 = 0;
      local_54 = 1;
    }
    else {
LAB_0014cb14:
      if (local_58 < '\x03') {
        printf("ADIOS-BP Version %d\n",(ulong)(uint)(int)local_58);
      }
      else {
        pbVar5 = (byte *)std::vector<char,_std::allocator<char>_>::operator[](&local_38,0x18);
        local_a1 = *pbVar5;
        pbVar5 = (byte *)std::vector<char,_std::allocator<char>_>::operator[](&local_38,0x19);
        local_a2 = *pbVar5;
        pbVar5 = (byte *)std::vector<char,_std::allocator<char>_>::operator[](&local_38,0x1a);
        local_a3 = *pbVar5;
        if (0x30 < local_a1) {
          local_a1 = local_a1 - 0x30;
          local_a2 = local_a2 - 0x30;
          local_a3 = local_a3 - 0x30;
        }
        do {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
          bVar2 = true;
          if (*pcVar4 != '.') {
            in_stack_fffffffffffffef0 =
                 (vector<char,_std::allocator<char>_> *)
                 std::__cxx11::string::operator[]((ulong)local_80);
            bVar2 = false;
            if ('/' < (char)(in_stack_fffffffffffffef0->
                            super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                            super__Tp_alloc_type) {
              pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
              bVar2 = *pcVar4 < ':';
            }
          }
        } while (bVar2);
        puVar11 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_80);
        *puVar11 = 0;
        pcVar4 = "Little Endian";
        if ((local_56 & 1) != 0) {
          pcVar4 = "Big Endian";
        }
        printf("ADIOS-BP Version %d %s - ADIOS v%d.%d.%d\n",(ulong)(uint)(int)local_58,pcVar4,
               (ulong)local_a1,(ulong)local_a2,(ulong)local_a3);
      }
      local_54 = 0;
    }
    std::__cxx11::string::~string(local_80);
    if (local_54 != 0) goto LAB_0014cd3d;
  }
  local_1 = 1;
  local_54 = 1;
LAB_0014cd3d:
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffef0);
  return (bool)(local_1 & 1);
}

Assistant:

bool introspectAsBPFile(std::ifstream &f, const std::string &name) noexcept
{
    const int MFOOTERSIZE = 56;
    std::vector<char> buffer(MFOOTERSIZE, 0);
    f.seekg(0, f.end);
    auto flength = f.tellg();
    if (flength < MFOOTERSIZE)
    {
        return false;
    }
    f.seekg(-MFOOTERSIZE, f.end);
    f.read(buffer.data(), MFOOTERSIZE);
    if (f)
    {
        const uint8_t endianness = static_cast<uint8_t>(buffer[52]);
        if (endianness > 1)
        {
            return false;
        }
        bool IsBigEndian = (endianness == 1) ? true : false;

        const int8_t fileType = static_cast<int8_t>(buffer[54]);
        if (fileType != 0 && fileType != 2 && fileType != 3)
        {
            return false;
        }
        const int8_t BPVersion = static_cast<uint8_t>(buffer[55]);
        if (BPVersion < 1 || BPVersion > 3)
        {
            return false;
        }

        size_t position = 0;
        std::string VersionTag(buffer.data(), 28);
        position = 28;

        if (!IsBigEndian)
        {
            uint64_t PGIndexStart = helper::ReadValue<uint64_t>(buffer, position, !IsBigEndian);
            uint64_t VarsIndexStart = helper::ReadValue<uint64_t>(buffer, position, !IsBigEndian);
            uint64_t AttributesIndexStart =
                helper::ReadValue<uint64_t>(buffer, position, !IsBigEndian);
            if (PGIndexStart >= VarsIndexStart || VarsIndexStart >= AttributesIndexStart ||
                AttributesIndexStart >= static_cast<uint64_t>(flength))
            {
                return false;
            }
        }

        if (BPVersion < 3)
        {
            printf("ADIOS-BP Version %d\n", BPVersion);
        }
        else
        {
            uint8_t major = static_cast<uint8_t>(buffer[24]);
            uint8_t minor = static_cast<uint8_t>(buffer[25]);
            uint8_t patch = static_cast<uint8_t>(buffer[26]);
            if (major > '0')
            {
                // ADIOS2 writes these as ASCII characters
                major -= '0';
                minor -= '0';
                patch -= '0';
            }

            /* Cleanup ADIOS2 bug here: VersionTag is not filled with 0s */
            int pos = 10;
            while (VersionTag[pos] == '.' || (VersionTag[pos] >= '0' && VersionTag[pos] <= '9'))
            {
                ++pos;
            }
            VersionTag[pos] = '\0';
            printf("ADIOS-BP Version %d %s - ADIOS v%d.%d.%d\n", BPVersion,
                   (IsBigEndian ? "Big Endian" : "Little Endian"), major, minor, patch);
        }
    }
    return true;
}